

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::ClientImpl::read_response_line(ClientImpl *this,Stream *strm,Request *req,Response *res)

{
  string *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  __ssize_t _Var4;
  string *psVar5;
  Response *__stream;
  long lVar6;
  FILE *__stream_00;
  size_t *__n;
  size_t *extraout_RDX;
  size_t *__n_00;
  size_t *__n_01;
  size_t *extraout_RDX_00;
  char **__lineptr;
  string_type *__lineptr_00;
  sub_match<const_char_*> *psVar7;
  cmatch m;
  string_type local_890;
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  
  __lineptr = (char **)0x0;
  __stream = res;
  memset(&buf,0,0x800);
  this_00 = &line_reader.glowable_buffer_;
  line_reader.fixed_buffer_size_ = 0x800;
  line_reader.fixed_buffer_used_size_ = 0;
  line_reader.glowable_buffer_._M_dataplus._M_p = (pointer)&line_reader.glowable_buffer_.field_2;
  line_reader.glowable_buffer_._M_string_length = 0;
  line_reader.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  line_reader.strm_ = strm;
  line_reader.fixed_buffer_ = buf._M_elems;
  _Var4 = detail::stream_line_reader::getline(&line_reader,__lineptr,__n,(FILE *)__stream);
  if ((char)_Var4 == '\0') {
    bVar1 = false;
  }
  else {
    if (read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)::
        re_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                                   ::re_abi_cxx11_);
      if (iVar3 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                    ::re_abi_cxx11_,"(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r?\n",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                      ::re_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                             ::re_abi_cxx11_);
      }
    }
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    m._M_begin = (char *)0x0;
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar5 = this_00;
    if (line_reader.glowable_buffer_._M_string_length == 0) {
      psVar5 = (string *)&line_reader.fixed_buffer_;
    }
    bVar1 = std::
            regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                      ((psVar5->_M_dataplus)._M_p,&m,
                       &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                        ::re_abi_cxx11_,0);
    if (bVar1) {
      lVar6 = (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar6 == 0) || (0xfffffffffffffffd < lVar6 / 0x18 - 5U)) {
        psVar7 = (sub_match<const_char_*> *)
                 ((long)m.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48);
      }
      else {
        psVar7 = m.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar7);
      std::__cxx11::string::operator=((string *)res,(string *)&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      lVar6 = (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar6 == 0) || (0xfffffffffffffffc < lVar6 / 0x18 - 6U)) {
        psVar7 = (sub_match<const_char_*> *)
                 ((long)m.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48);
      }
      else {
        psVar7 = m.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar7);
      iVar3 = std::__cxx11::stoi(&local_890,(size_t *)0x0,10);
      res->status = iVar3;
      std::__cxx11::string::~string((string *)&local_890);
      __stream_00 = (FILE *)((long)m.
                                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)m.
                                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      if ((__stream_00 == (FILE *)0x0) || (0xfffffffffffffffb < (long)__stream_00 / 0x18 - 7U)) {
        psVar7 = (sub_match<const_char_*> *)
                 ((long)m.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)__stream_00 + -0x48);
      }
      else {
        psVar7 = m.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3;
      }
      std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar7);
      __lineptr_00 = &local_890;
      std::__cxx11::string::operator=((string *)&res->reason,(string *)&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      __n_00 = extraout_RDX;
      while (bVar1 = res->status != 100, !bVar1) {
        _Var4 = detail::stream_line_reader::getline
                          (&line_reader,(char **)__lineptr_00,__n_00,__stream_00);
        if ((char)_Var4 == '\0') break;
        _Var4 = detail::stream_line_reader::getline
                          (&line_reader,(char **)__lineptr_00,__n_01,__stream_00);
        if ((char)_Var4 == '\0') break;
        psVar5 = this_00;
        if (line_reader.glowable_buffer_._M_string_length == 0) {
          psVar5 = (string *)&line_reader.fixed_buffer_;
        }
        bVar2 = std::
                regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                          ((psVar5->_M_dataplus)._M_p,&m,
                           &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                            ::re_abi_cxx11_,0);
        if (!bVar2) break;
        lVar6 = (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar6 == 0) || (0xfffffffffffffffd < lVar6 / 0x18 - 5U)) {
          psVar7 = (sub_match<const_char_*> *)
                   ((long)m.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48);
        }
        else {
          psVar7 = m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar7);
        std::__cxx11::string::operator=((string *)res,(string *)&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        lVar6 = (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar6 == 0) || (0xfffffffffffffffc < lVar6 / 0x18 - 6U)) {
          psVar7 = (sub_match<const_char_*> *)
                   ((long)m.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48);
        }
        else {
          psVar7 = m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
        }
        std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar7);
        iVar3 = std::__cxx11::stoi(&local_890,(size_t *)0x0,10);
        res->status = iVar3;
        std::__cxx11::string::~string((string *)&local_890);
        __stream_00 = (FILE *)((long)m.
                                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)m.
                                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if ((__stream_00 == (FILE *)0x0) || (0xfffffffffffffffb < (long)__stream_00 / 0x18 - 7U)) {
          psVar7 = (sub_match<const_char_*> *)
                   ((long)m.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)__stream_00 + -0x48);
        }
        else {
          psVar7 = m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 3;
        }
        std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar7);
        __lineptr_00 = &local_890;
        std::__cxx11::string::operator=((string *)&res->reason,(string *)&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        __n_00 = extraout_RDX_00;
      }
    }
    else {
      bVar1 = std::operator==(&req->method,"CONNECT");
    }
    std::
    _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)&m);
  }
  std::__cxx11::string::~string((string *)this_00);
  return bVar1;
}

Assistant:

inline bool ClientImpl::read_response_line(Stream &strm, const Request &req,
                                           Response &res) {
  std::array<char, 2048> buf{};

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  if (!line_reader.getline()) { return false; }

#ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
  const static std::regex re("(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r\n");
#else
  const static std::regex re("(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r?\n");
#endif

  std::cmatch m;
  if (!std::regex_match(line_reader.ptr(), m, re)) {
    return req.method == "CONNECT";
  }
  res.version = std::string(m[1]);
  res.status = std::stoi(std::string(m[2]));
  res.reason = std::string(m[3]);

  // Ignore '100 Continue'
  while (res.status == 100) {
    if (!line_reader.getline()) { return false; } // CRLF
    if (!line_reader.getline()) { return false; } // next response line

    if (!std::regex_match(line_reader.ptr(), m, re)) { return false; }
    res.version = std::string(m[1]);
    res.status = std::stoi(std::string(m[2]));
    res.reason = std::string(m[3]);
  }

  return true;
}